

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::number::impl::DecimalQuantity::toPlainString
          (UnicodeString *__return_storage_ptr__,DecimalQuantity *this)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  undefined8 in_RAX;
  uint uVar5;
  int iVar6;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b5258;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  uStack_38 = in_RAX;
  if ((this->flags & 1U) != 0) {
    uStack_38._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
    uStack_38._0_4_ = (undefined4)in_RAX;
    uStack_38._0_6_ = CONCAT24(0x2d,(undefined4)uStack_38);
    UnicodeString::doAppend(__return_storage_ptr__,(UChar *)((long)&uStack_38 + 4),0,1);
  }
  if ((this->precision == 0) || (this->precision + this->scale + -1 < 0)) {
    uStack_38 = CONCAT26(0x30,(undefined6)uStack_38);
    UnicodeString::doAppend(__return_storage_ptr__,(UChar *)((long)&uStack_38 + 6),0,1);
  }
  iVar4 = this->precision + this->scale;
  iVar2 = this->lOptPos;
  if (iVar4 <= this->lOptPos) {
    iVar2 = iVar4;
  }
  if (iVar4 < this->lReqPos) {
    iVar2 = this->lReqPos;
  }
  iVar4 = iVar2 * 4;
  while( true ) {
    iVar4 = iVar4 + -4;
    iVar1 = this->scale;
    iVar6 = this->rOptPos;
    if (this->rOptPos <= iVar1) {
      iVar6 = iVar1;
    }
    if (this->rReqPos < iVar1) {
      iVar6 = this->rReqPos;
    }
    if (iVar2 <= iVar6) break;
    if (iVar2 == 0) {
      uStack_38._0_4_ = CONCAT22(0x2e,(undefined2)uStack_38);
      UnicodeString::doAppend(__return_storage_ptr__,(UChar *)((long)&uStack_38 + 2),0,1);
    }
    uVar5 = ~this->scale + iVar2;
    if (this->usingBytes == true) {
      bVar3 = 0;
      if ((-1 < (int)uVar5) && (bVar3 = 0, (int)uVar5 < this->precision)) {
        bVar3 = (this->fBCD).bcdBytes.ptr[uVar5];
      }
    }
    else if (uVar5 < 0x10) {
      bVar3 = (byte)((this->fBCD).bcdLong >> ((char)iVar4 - (char)(this->scale << 2) & 0x3fU)) & 0xf
      ;
    }
    else {
      bVar3 = 0;
    }
    UnicodeString::append(__return_storage_ptr__,(char)bVar3 + 0x30);
    iVar2 = iVar2 + -1;
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalQuantity::toPlainString() const {
    U_ASSERT(!isApproximate);
    UnicodeString sb;
    if (isNegative()) {
        sb.append(u'-');
    }
    if (precision == 0 || getMagnitude() < 0) {
        sb.append(u'0');
    }
    for (int m = getUpperDisplayMagnitude(); m >= getLowerDisplayMagnitude(); m--) {
        if (m == -1) { sb.append(u'.'); }
        sb.append(getDigit(m) + u'0');
    }
    return sb;
}